

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int lyp_check_pattern(ly_ctx *ctx,char *pattern,pcre **pcre_precomp)

{
  char cVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  pcre *__ptr;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  int iVar10;
  long lVar11;
  char *pcVar12;
  uint uVar13;
  uint uVar14;
  char *local_68;
  char *err_msg;
  long local_58;
  pcre **local_50;
  int local_44;
  char *pcStack_40;
  int err_offset;
  ly_ctx *local_38;
  
  lVar11 = 4;
  pcVar4 = pattern;
  local_50 = pcre_precomp;
  while (pcVar4 = strchr(pcVar4,0x24), pcVar4 != (char *)0x0) {
    pcVar4 = pcVar4 + 1;
    lVar11 = lVar11 + 1;
  }
  sVar5 = strlen(pattern);
  pcVar4 = (char *)malloc(lVar11 + sVar5);
  if (pcVar4 != (char *)0x0) {
    *pcVar4 = '\0';
    if ((pattern[sVar5 - 2] != '.') || (pcVar12 = pcVar4, pattern[sVar5 - 1] != '*')) {
      *pcVar4 = '(';
      pcVar12 = pcVar4 + 1;
    }
    pcVar9 = pattern;
    do {
      cVar1 = *pcVar9;
      if (cVar1 == '$') {
        pcVar12[2] = '\0';
        pcVar12[0] = '\\';
        pcVar12[1] = '$';
        lVar11 = 2;
      }
      else {
        if (cVar1 == '\0') goto LAB_001227a0;
        *pcVar12 = cVar1;
        lVar11 = 1;
      }
      pcVar12 = pcVar12 + lVar11;
      pcVar9 = pcVar9 + 1;
    } while( true );
  }
LAB_0012299e:
  ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyp_check_pattern");
  return 1;
LAB_001227a0:
  sVar5 = strlen(pattern);
  pcStack_40 = pattern;
  local_38 = ctx;
  if ((pattern[sVar5 - 2] == '.') && (pattern[sVar5 - 1] == '*')) {
    *pcVar12 = '\0';
  }
  else {
    pcVar12[2] = '\0';
    pcVar12[0] = ')';
    pcVar12[1] = '$';
  }
  do {
    pcVar12 = strstr(pcVar4,"\\p{Is");
    if (pcVar12 == (char *)0x0) {
      __ptr = (pcre *)pcre_compile(pcVar4,0x1030,&local_68,&local_44,0);
      if (__ptr == (pcre *)0x0) {
        pcVar12 = pcVar4 + local_44;
LAB_00122976:
        ly_vlog(local_38,LYE_INREGEX,LY_VLOG_NONE,(void *)0x0,pcStack_40,pcVar12,local_68);
        free(pcVar4);
        iVar10 = 1;
      }
      else {
        free(pcVar4);
        if (local_50 == (pcre **)0x0) {
          free(__ptr);
        }
        else {
          *local_50 = __ptr;
        }
        iVar10 = 0;
      }
      return iVar10;
    }
    uVar14 = (int)pcVar12 - (int)pcVar4;
    pcVar12 = strchr(pcVar12,0x7d);
    if (pcVar12 == (char *)0x0) {
      pcVar12 = pcVar4 + (long)(int)uVar14 + 2;
      local_68 = "unterminated character property";
      goto LAB_00122976;
    }
    uVar13 = ((int)pcVar12 - (int)pcVar4) + 1;
    iVar10 = uVar13 - uVar14;
    if (iVar10 < 0x13) {
      sVar5 = strlen(pcVar4);
      pcVar4 = (char *)ly_realloc(pcVar4,(0x13 - iVar10) + sVar5 + 1);
      ctx = local_38;
      if (pcVar4 == (char *)0x0) goto LAB_0012299e;
    }
    local_58 = (long)(int)uVar14;
    pcVar12 = pcVar4 + local_58 + 5;
    lVar11 = -8;
    err_msg = (char *)(ulong)uVar13;
    do {
      lVar7 = lVar11;
      if (lVar7 + 0x10 == 0x538) {
        local_68 = "unknown block name";
        goto LAB_00122976;
      }
      pcVar9 = *(char **)((long)lyp_ublock2urange[0] + lVar7 + 8);
      sVar5 = strlen(pcVar9);
      iVar10 = strncmp(pcVar12,pcVar9,sVar5);
      lVar11 = lVar7 + 0x10;
    } while (iVar10 != 0);
    uVar6 = 0;
    uVar8 = 0;
    if (0 < (int)uVar14) {
      uVar8 = (ulong)uVar14;
    }
    iVar10 = 0;
    for (; uVar8 != uVar6; uVar6 = uVar6 + 1) {
      if (pcVar4[uVar6] == ']') {
        if ((uVar6 == 0) || (pcVar4[uVar6 - 1] != '\\')) {
          iVar10 = iVar10 + -1;
        }
      }
      else if ((pcVar4[uVar6] == '[') && ((uVar6 == 0 || (pcVar4[uVar6 - 1] != '\\')))) {
        iVar10 = iVar10 + 1;
      }
    }
    pcVar9 = pcVar4 + local_58;
    pcVar12 = pcVar4 + (int)err_msg;
    sVar5 = strlen(pcVar12);
    if (iVar10 == 0) {
      memmove(pcVar9 + 0x13,pcVar12,sVar5 + 1);
      puVar2 = *(undefined8 **)((long)lyp_ublock2urange[1] + lVar7);
      uVar3 = puVar2[1];
      *(undefined8 *)pcVar9 = *puVar2;
      *(undefined8 *)(pcVar9 + 8) = uVar3;
      *(undefined4 *)(pcVar9 + 0xf) = *(undefined4 *)((long)puVar2 + 0xf);
    }
    else {
      memmove(pcVar9 + 0x11,pcVar12,sVar5 + 1);
      lVar11 = *(long *)((long)lyp_ublock2urange[1] + lVar7);
      uVar3 = *(undefined8 *)(lVar11 + 9);
      *(undefined8 *)pcVar9 = *(undefined8 *)(lVar11 + 1);
      *(undefined8 *)(pcVar9 + 8) = uVar3;
      pcVar9[0x10] = *(char *)(lVar11 + 0x11);
    }
  } while( true );
}

Assistant:

int
lyp_check_pattern(struct ly_ctx *ctx, const char *pattern, pcre **pcre_precomp)
{
    int idx, idx2, start, end, err_offset, count;
    char *perl_regex, *ptr;
    const char *err_msg, *orig_ptr;
    pcre *precomp;

    /*
     * adjust the expression to a Perl equivalent
     *
     * http://www.w3.org/TR/2004/REC-xmlschema-2-20041028/#regexs
     */

    /* we need to replace all "$" with "\$", count them now */
    for (count = 0, ptr = strchr(pattern, '$'); ptr; ++count, ptr = strchr(ptr + 1, '$'));

    perl_regex = malloc((strlen(pattern) + 4 + count) * sizeof(char));
    LY_CHECK_ERR_RETURN(!perl_regex, LOGMEM(ctx), EXIT_FAILURE);
    perl_regex[0] = '\0';

    ptr = perl_regex;

    if (strncmp(pattern + strlen(pattern) - 2, ".*", 2)) {
        /* we wil add line-end anchoring */
        ptr[0] = '(';
        ++ptr;
    }

    for (orig_ptr = pattern; orig_ptr[0]; ++orig_ptr) {
        if (orig_ptr[0] == '$') {
            ptr += sprintf(ptr, "\\$");
        } else {
            ptr[0] = orig_ptr[0];
            ++ptr;
        }
    }

    if (strncmp(pattern + strlen(pattern) - 2, ".*", 2)) {
        ptr += sprintf(ptr, ")$");
    } else {
        ptr[0] = '\0';
        ++ptr;
    }

    /* substitute Unicode Character Blocks with exact Character Ranges */
    while ((ptr = strstr(perl_regex, "\\p{Is"))) {
        start = ptr - perl_regex;

        ptr = strchr(ptr, '}');
        if (!ptr) {
            LOGVAL(ctx, LYE_INREGEX, LY_VLOG_NONE, NULL, pattern, perl_regex + start + 2, "unterminated character property");
            free(perl_regex);
            return EXIT_FAILURE;
        }

        end = (ptr - perl_regex) + 1;

        /* need more space */
        if (end - start < LYP_URANGE_LEN) {
            perl_regex = ly_realloc(perl_regex, strlen(perl_regex) + (LYP_URANGE_LEN - (end - start)) + 1);
            LY_CHECK_ERR_RETURN(!perl_regex, LOGMEM(ctx); free(perl_regex), EXIT_FAILURE);
        }

        /* find our range */
        for (idx = 0; lyp_ublock2urange[idx][0]; ++idx) {
            if (!strncmp(perl_regex + start + 5, lyp_ublock2urange[idx][0], strlen(lyp_ublock2urange[idx][0]))) {
                break;
            }
        }
        if (!lyp_ublock2urange[idx][0]) {
            LOGVAL(ctx, LYE_INREGEX, LY_VLOG_NONE, NULL, pattern, perl_regex + start + 5, "unknown block name");
            free(perl_regex);
            return EXIT_FAILURE;
        }

        /* make the space in the string and replace the block (but we cannot include brackets if it was already enclosed in them) */
        for (idx2 = 0, count = 0; idx2 < start; ++idx2) {
            if ((perl_regex[idx2] == '[') && (!idx2 || (perl_regex[idx2 - 1] != '\\'))) {
                ++count;
            }
            if ((perl_regex[idx2] == ']') && (!idx2 || (perl_regex[idx2 - 1] != '\\'))) {
                --count;
            }
        }
        if (count) {
            /* skip brackets */
            memmove(perl_regex + start + (LYP_URANGE_LEN - 2), perl_regex + end, strlen(perl_regex + end) + 1);
            memcpy(perl_regex + start, lyp_ublock2urange[idx][1] + 1, LYP_URANGE_LEN - 2);
        } else {
            memmove(perl_regex + start + LYP_URANGE_LEN, perl_regex + end, strlen(perl_regex + end) + 1);
            memcpy(perl_regex + start, lyp_ublock2urange[idx][1], LYP_URANGE_LEN);
        }
    }

    /* must return 0, already checked during parsing */
    precomp = pcre_compile(perl_regex, PCRE_ANCHORED | PCRE_DOLLAR_ENDONLY | PCRE_NO_AUTO_CAPTURE,
                           &err_msg, &err_offset, NULL);
    if (!precomp) {
        LOGVAL(ctx, LYE_INREGEX, LY_VLOG_NONE, NULL, pattern, perl_regex + err_offset, err_msg);
        free(perl_regex);
        return EXIT_FAILURE;
    }
    free(perl_regex);

    if (pcre_precomp) {
        *pcre_precomp = precomp;
    } else {
        free(precomp);
    }

    return EXIT_SUCCESS;
}